

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.hpp
# Opt level: O2

void __thiscall
boost::unit_test::framework::internal_error::internal_error(internal_error *this,const_string *m)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,m->m_begin,m->m_end);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  *(undefined ***)this = &PTR__runtime_error_001e0a08;
  return;
}

Assistant:

struct BOOST_TEST_DECL internal_error : public std::runtime_error {
    internal_error( const_string m ) : std::runtime_error( std::string( m.begin(), m.size() ) ) {}
}